

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetPropertyCommand.cxx
# Opt level: O1

bool cmSetPropertyCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  bool remove;
  cmExecutionStatus *status_00;
  bool appendAsString;
  bool bVar4;
  int iVar5;
  int iVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__x;
  undefined8 uVar7;
  undefined8 in_RCX;
  bool appendMode;
  byte bVar8;
  byte bVar9;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string propertyName;
  vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> source_file_directory_makefiles;
  string propertyValue;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  source_file_target_directories;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  source_file_directories;
  undefined4 local_15c;
  string local_158;
  undefined1 local_138 [16];
  cmMakefile *local_128;
  pointer local_120;
  char local_118 [8];
  char *local_110;
  string local_108;
  uint local_e4;
  string *local_e0;
  undefined8 local_d8;
  char *local_d0;
  undefined8 local_c8;
  cmExecutionStatus *local_c0;
  undefined1 local_b8 [12];
  uint uStack_ac;
  _Base_ptr local_a8;
  _Base_ptr local_a0;
  _Base_ptr local_98;
  size_t local_90;
  string local_88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1) < 0x21) {
    local_138._0_8_ = &local_128;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_138,"called with incorrect number of arguments","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    local_158._M_dataplus._M_p = (pointer)local_138._0_8_;
    if ((cmMakefile **)local_138._0_8_ == &local_128) {
      return false;
    }
LAB_0023c05f:
    operator_delete(local_158._M_dataplus._M_p,
                    (ulong)((long)&(local_128->FindPackageRootPathStack).
                                   super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                   ._M_impl.super__Deque_impl_data._M_map + 1));
    return false;
  }
  iVar5 = std::__cxx11::string::compare((char *)pbVar1);
  if (iVar5 == 0) {
    local_15c = 3;
LAB_0023c1c4:
    local_e4 = 0;
  }
  else {
    iVar5 = std::__cxx11::string::compare((char *)pbVar1);
    if (iVar5 == 0) {
      local_15c = 2;
      goto LAB_0023c1c4;
    }
    iVar5 = std::__cxx11::string::compare((char *)pbVar1);
    if (iVar5 == 0) {
      local_15c = 0;
      goto LAB_0023c1c4;
    }
    iVar5 = std::__cxx11::string::compare((char *)pbVar1);
    if (iVar5 != 0) {
      iVar5 = std::__cxx11::string::compare((char *)pbVar1);
      if (iVar5 == 0) {
        local_15c = 5;
      }
      else {
        iVar5 = std::__cxx11::string::compare((char *)pbVar1);
        if (iVar5 == 0) {
          local_15c = 4;
        }
        else {
          iVar5 = std::__cxx11::string::compare((char *)pbVar1);
          if (iVar5 != 0) {
            local_138._0_8_ = &DAT_00000014;
            local_138._8_8_ = "given invalid scope ";
            unique0x00012000 = (pbVar1->_M_dataplus)._M_p;
            local_b8._0_8_ = pbVar1->_M_string_length;
            cmStrCat<char[77]>(&local_158,(cmAlphaNum *)local_138,(cmAlphaNum *)local_b8,
                               (char (*) [77])
                               ".  Valid scopes are GLOBAL, DIRECTORY, TARGET, SOURCE, TEST, CACHE, INSTALL."
                              );
            std::__cxx11::string::_M_assign((string *)&status->Error);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_158._M_dataplus._M_p == &local_158.field_2) {
              return false;
            }
            local_128 = (cmMakefile *)
                        CONCAT71(local_158.field_2._M_allocated_capacity._1_7_,
                                 local_158.field_2._M_local_buf[0]);
            goto LAB_0023c05f;
          }
          local_15c = 8;
        }
      }
      goto LAB_0023c1c4;
    }
    local_15c = 1;
    local_e4 = (uint)CONCAT71((int7)((ulong)in_RCX >> 8),1);
  }
  local_a0 = (_Base_ptr)(local_b8 + 8);
  stack0xffffffffffffff50 = (pointer)((ulong)uStack_ac << 0x20);
  appendMode = false;
  local_a8 = (_Base_ptr)0x0;
  local_90 = 0;
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  local_158._M_string_length = 0;
  local_158.field_2._M_local_buf[0] = '\0';
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  local_108._M_string_length = 0;
  local_108.field_2._M_local_buf[0] = '\0';
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_e0 = (string *)&status->Error;
  local_d0 = "";
  iVar5 = 1;
  remove = true;
  local_e4 = local_e4 ^ 1;
  local_c8 = 0;
  local_d8 = 0;
  appendAsString = false;
  pbVar3 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_c0 = status;
  local_98 = local_a0;
  do {
    __x = pbVar3 + 1;
    if (__x == pbVar2) break;
    iVar6 = std::__cxx11::string::compare((char *)__x);
    if (iVar6 == 0) {
      bVar4 = true;
      iVar5 = 2;
    }
    else {
      iVar6 = std::__cxx11::string::compare((char *)__x);
      if (iVar6 == 0) {
        appendMode = true;
        remove = false;
        iVar5 = 0;
        appendAsString = false;
        goto LAB_0023c377;
      }
      iVar6 = std::__cxx11::string::compare((char *)__x);
      bVar4 = true;
      if (iVar6 == 0) {
        remove = false;
        appendMode = true;
        iVar5 = 0;
        appendAsString = true;
      }
      else if (iVar5 - 4U < 0xfffffffe && (char)local_e4 == '\0') {
        uVar7 = std::__cxx11::string::compare((char *)__x);
        if ((int)uVar7 == 0) {
          local_c8 = CONCAT71((int7)((ulong)uVar7 >> 8),1);
          iVar5 = 4;
        }
        else {
          uVar7 = std::__cxx11::string::compare((char *)__x);
          if ((int)uVar7 != 0) goto LAB_0023c325;
          local_d8 = CONCAT71((int7)((ulong)uVar7 >> 8),1);
          iVar5 = 5;
        }
LAB_0023c377:
        bVar4 = true;
      }
      else {
LAB_0023c325:
        switch(iVar5) {
        case 1:
          iVar5 = 1;
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)local_b8,__x);
          break;
        case 2:
          iVar5 = 3;
          std::__cxx11::string::_M_assign((string *)&local_158);
          break;
        case 3:
          std::__cxx11::string::append((char *)&local_108);
          std::__cxx11::string::_M_append((char *)&local_108,(ulong)(__x->_M_dataplus)._M_p);
          iVar5 = 3;
          remove = false;
          local_d0 = ";";
          break;
        case 4:
          iVar5 = 4;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_48,__x);
          break;
        case 5:
          iVar5 = 5;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_68,__x);
          break;
        default:
          local_120 = (__x->_M_dataplus)._M_p;
          local_128 = (cmMakefile *)pbVar3[1]._M_string_length;
          local_138._0_8_ = (cmMakefile **)0x18;
          local_138._8_8_ = "given invalid argument \"";
          local_118[0] = '\x02';
          local_118[1] = '\0';
          local_118[2] = '\0';
          local_118[3] = '\0';
          local_118[4] = '\0';
          local_118[5] = '\0';
          local_118[6] = '\0';
          local_118[7] = '\0';
          local_110 = "\".";
          views._M_len = 3;
          views._M_array = (iterator)local_138;
          cmCatViews_abi_cxx11_(&local_88,views);
          std::__cxx11::string::_M_assign(local_e0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != &local_88.field_2) {
            operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
          }
          bVar4 = false;
        }
      }
    }
    pbVar3 = __x;
  } while (bVar4);
  status_00 = local_c0;
  if (__x == pbVar2) {
    if (local_158._M_string_length != 0) {
      local_138._0_8_ = (cmMakefile **)0x0;
      local_138._8_8_ = (pointer)0x0;
      local_128 = (cmMakefile *)0x0;
      bVar9 = (byte)local_c8;
      bVar8 = (byte)local_d8;
      bVar4 = SetPropertyCommand::HandleAndValidateSourceFileDirectoryScopes
                        (local_c0,(bool)(bVar9 & 1),(bool)(bVar8 & 1),&local_48,&local_68,
                         (vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> *)local_138);
      if (bVar4) {
        bVar4 = true;
        switch(local_15c) {
        case 0:
          bVar4 = anon_unknown.dwarf_89a243::HandleTargetMode
                            (status_00,
                             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_b8,&local_158,&local_108,appendAsString,appendMode,remove);
          break;
        case 1:
          bVar4 = anon_unknown.dwarf_89a243::HandleSourceMode
                            (status_00,
                             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_b8,&local_158,&local_108,appendAsString,appendMode,remove,
                             (vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> *)local_138,
                             (bool)((bVar9 | bVar8) & 1));
          break;
        case 2:
          bVar4 = anon_unknown.dwarf_89a243::HandleDirectoryMode
                            (status_00,
                             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_b8,&local_158,&local_108,appendAsString,appendMode,remove);
          break;
        case 3:
          bVar4 = anon_unknown.dwarf_89a243::HandleGlobalMode
                            (status_00,
                             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_b8,&local_158,&local_108,appendAsString,appendMode,remove);
          break;
        case 4:
          bVar4 = anon_unknown.dwarf_89a243::HandleCacheMode
                            (status_00,
                             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_b8,&local_158,&local_108,appendAsString,appendMode,remove);
          break;
        case 5:
          bVar4 = anon_unknown.dwarf_89a243::HandleTestMode
                            (status_00,
                             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_b8,&local_158,&local_108,appendAsString,appendMode,remove);
          break;
        case 8:
          bVar4 = anon_unknown.dwarf_89a243::HandleInstallMode
                            (status_00,
                             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_b8,&local_158,&local_108,appendAsString,appendMode,remove);
        }
      }
      else {
        bVar4 = false;
      }
      if ((cmMakefile **)local_138._0_8_ != (cmMakefile **)0x0) {
        operator_delete((void *)local_138._0_8_,(long)local_128 - local_138._0_8_);
      }
      goto LAB_0023c4ee;
    }
    local_138._0_8_ = &local_128;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_138,"not given a PROPERTY <name> argument.","");
    std::__cxx11::string::_M_assign(local_e0);
    if ((cmMakefile **)local_138._0_8_ != &local_128) {
      operator_delete((void *)local_138._0_8_,
                      (ulong)((long)&(local_128->FindPackageRootPathStack).
                                     super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                     ._M_impl.super__Deque_impl_data._M_map + 1));
    }
  }
  bVar4 = false;
LAB_0023c4ee:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_68);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,
                    CONCAT71(local_108.field_2._M_allocated_capacity._1_7_,
                             local_108.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,
                    CONCAT71(local_158.field_2._M_allocated_capacity._1_7_,
                             local_158.field_2._M_local_buf[0]) + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_b8);
  return bVar4;
}

Assistant:

bool cmSetPropertyCommand(std::vector<std::string> const& args,
                          cmExecutionStatus& status)
{
  if (args.size() < 2) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }

  // Get the scope on which to set the property.
  std::string const& scopeName = args.front();
  cmProperty::ScopeType scope;
  if (scopeName == "GLOBAL") {
    scope = cmProperty::GLOBAL;
  } else if (scopeName == "DIRECTORY") {
    scope = cmProperty::DIRECTORY;
  } else if (scopeName == "TARGET") {
    scope = cmProperty::TARGET;
  } else if (scopeName == "SOURCE") {
    scope = cmProperty::SOURCE_FILE;
  } else if (scopeName == "TEST") {
    scope = cmProperty::TEST;
  } else if (scopeName == "CACHE") {
    scope = cmProperty::CACHE;
  } else if (scopeName == "INSTALL") {
    scope = cmProperty::INSTALL;
  } else {
    status.SetError(cmStrCat("given invalid scope ", scopeName,
                             ".  "
                             "Valid scopes are GLOBAL, DIRECTORY, "
                             "TARGET, SOURCE, TEST, CACHE, INSTALL."));
    return false;
  }

  bool appendAsString = false;
  bool appendMode = false;
  bool remove = true;
  std::set<std::string> names;
  std::string propertyName;
  std::string propertyValue;

  std::vector<std::string> source_file_directories;
  std::vector<std::string> source_file_target_directories;
  bool source_file_directory_option_enabled = false;
  bool source_file_target_option_enabled = false;

  // Parse the rest of the arguments up to the values.
  enum Doing
  {
    DoingNone,
    DoingNames,
    DoingProperty,
    DoingValues,
    DoingSourceDirectory,
    DoingSourceTargetDirectory
  };
  Doing doing = DoingNames;
  const char* sep = "";
  for (std::string const& arg : cmMakeRange(args).advance(1)) {
    if (arg == "PROPERTY") {
      doing = DoingProperty;
    } else if (arg == "APPEND") {
      doing = DoingNone;
      appendMode = true;
      remove = false;
      appendAsString = false;
    } else if (arg == "APPEND_STRING") {
      doing = DoingNone;
      appendMode = true;
      remove = false;
      appendAsString = true;
    } else if (doing != DoingProperty && doing != DoingValues &&
               scope == cmProperty::SOURCE_FILE && arg == "DIRECTORY") {
      doing = DoingSourceDirectory;
      source_file_directory_option_enabled = true;
    } else if (doing != DoingProperty && doing != DoingValues &&
               scope == cmProperty::SOURCE_FILE && arg == "TARGET_DIRECTORY") {
      doing = DoingSourceTargetDirectory;
      source_file_target_option_enabled = true;
    } else if (doing == DoingNames) {
      names.insert(arg);
    } else if (doing == DoingSourceDirectory) {
      source_file_directories.push_back(arg);
    } else if (doing == DoingSourceTargetDirectory) {
      source_file_target_directories.push_back(arg);
    } else if (doing == DoingProperty) {
      propertyName = arg;
      doing = DoingValues;
    } else if (doing == DoingValues) {
      propertyValue += sep;
      sep = ";";
      propertyValue += arg;
      remove = false;
    } else {
      status.SetError(cmStrCat("given invalid argument \"", arg, "\"."));
      return false;
    }
  }

  // Make sure a property name was found.
  if (propertyName.empty()) {
    status.SetError("not given a PROPERTY <name> argument.");
    return false;
  }

  std::vector<cmMakefile*> source_file_directory_makefiles;
  bool file_scopes_handled =
    SetPropertyCommand::HandleAndValidateSourceFileDirectoryScopes(
      status, source_file_directory_option_enabled,
      source_file_target_option_enabled, source_file_directories,
      source_file_target_directories, source_file_directory_makefiles);
  if (!file_scopes_handled) {
    return false;
  }
  bool source_file_paths_should_be_absolute =
    source_file_directory_option_enabled || source_file_target_option_enabled;

  // Dispatch property setting.
  switch (scope) {
    case cmProperty::GLOBAL:
      return HandleGlobalMode(status, names, propertyName, propertyValue,
                              appendAsString, appendMode, remove);
    case cmProperty::DIRECTORY:
      return HandleDirectoryMode(status, names, propertyName, propertyValue,
                                 appendAsString, appendMode, remove);
    case cmProperty::TARGET:
      return HandleTargetMode(status, names, propertyName, propertyValue,
                              appendAsString, appendMode, remove);
    case cmProperty::SOURCE_FILE:
      return HandleSourceMode(status, names, propertyName, propertyValue,
                              appendAsString, appendMode, remove,
                              source_file_directory_makefiles,
                              source_file_paths_should_be_absolute);
    case cmProperty::TEST:
      return HandleTestMode(status, names, propertyName, propertyValue,
                            appendAsString, appendMode, remove);
    case cmProperty::CACHE:
      return HandleCacheMode(status, names, propertyName, propertyValue,
                             appendAsString, appendMode, remove);
    case cmProperty::INSTALL:
      return HandleInstallMode(status, names, propertyName, propertyValue,
                               appendAsString, appendMode, remove);

    case cmProperty::VARIABLE:
    case cmProperty::CACHED_VARIABLE:
      break; // should never happen
  }
  return true;
}